

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

Bool prvTidynodeIsHeader(Node *node)

{
  Bool BVar1;
  
  BVar1 = no;
  if ((node != (Node *)0x0) && (BVar1 = no, node->tag != (Dict *)0x0)) {
    BVar1 = node->tag->id;
  }
  if (BVar1 - 0x28 < 5) {
    BVar1 = yes;
  }
  else if (BVar1 != no) {
    return (uint)(BVar1 == 0x2d);
  }
  return BVar1;
}

Assistant:

Bool TY_(nodeIsHeader)( Node* node )
{
    TidyTagId tid = TagId( node  );
    return ( tid && (
             tid == TidyTag_H1 ||
             tid == TidyTag_H2 ||
             tid == TidyTag_H3 ||
             tid == TidyTag_H4 ||
             tid == TidyTag_H5 ||
             tid == TidyTag_H6 ));
}